

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

void __thiscall libmatroska::KaxBlockGroup::SetBlockDuration(KaxBlockGroup *this,uint64 TimeLength)

{
  uint64 uVar1;
  EbmlUInteger *this_00;
  KaxBlockDuration *myDuration;
  int64 scale;
  uint64 TimeLength_local;
  KaxBlockGroup *this_local;
  
  if (this->ParentTrack != (KaxTrackEntry *)0x0) {
    uVar1 = KaxTrackEntry::GlobalTimecodeScale(this->ParentTrack);
    this_00 = (EbmlUInteger *)
              libebml::EbmlMaster::FindFirstElt
                        (&this->super_EbmlMaster,(EbmlCallbacks *)KaxBlockDuration::ClassInfos,true)
    ;
    libebml::EbmlUInteger::operator=(this_00,TimeLength / uVar1);
    return;
  }
  __assert_fail("ParentTrack != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                ,0x365,"void libmatroska::KaxBlockGroup::SetBlockDuration(uint64)");
}

Assistant:

void KaxBlockGroup::SetBlockDuration(uint64 TimeLength)
{
  assert(ParentTrack != NULL);
  int64 scale = ParentTrack->GlobalTimecodeScale();
  KaxBlockDuration & myDuration = *static_cast<KaxBlockDuration *>(FindFirstElt(EBML_INFO(KaxBlockDuration), true));
  *(static_cast<EbmlUInteger *>(&myDuration)) = TimeLength / uint64(scale);
}